

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

mecab_node_t * __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::lookup<false>
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,char *begin,char *end,
          Allocator<mecab_node_t,_mecab_path_t> *allocator,Lattice *lattice)

{
  pointer ppVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  result_type *prVar5;
  unsigned_short uVar6;
  CharInfo CVar7;
  char *key;
  mecab_node_t *pmVar8;
  size_t sVar9;
  char *pcVar10;
  CharInfo CVar11;
  ulong uVar12;
  pointer ppDVar13;
  char *pcVar14;
  long lVar15;
  Token *pTVar16;
  char *pcVar17;
  ulong uVar18;
  bool bVar19;
  CharInfo cinfo;
  mecab_node_t *local_b0;
  mecab_node_t *new_node;
  char *local_88;
  Allocator<mecab_node_t,_mecab_path_t> *local_80;
  char *local_78;
  char *local_70;
  size_t mblen;
  size_t local_60;
  size_t clen;
  CharProperty *local_50;
  result_type *local_48;
  size_t local_40;
  CharInfo fail;
  
  cinfo = (CharInfo)0x0;
  mblen = 0;
  clen = 0;
  pcVar14 = begin + 0xffff;
  if ((ulong)((long)end - (long)begin) < 0xffff) {
    pcVar14 = end;
  }
  local_50 = &this->property_;
  key = CharProperty::seekToOtherType(local_50,begin,pcVar14,this->space_,&cinfo,&mblen,&clen);
  local_48 = (allocator->results_).ptr_;
  ppDVar13 = (this->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = (long)pcVar14 - (long)key;
  sVar3 = (short)key;
  local_b0 = (mecab_node_t *)0x0;
  local_80 = allocator;
  local_78 = begin;
  local_70 = pcVar14;
  for (; sVar9 = mblen,
      ppDVar13 !=
      (this->dic_).super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppDVar13 = ppDVar13 + 1) {
    local_88 = (char *)Dictionary::commonPrefixSearch(*ppDVar13,key,local_40,local_48,0x200);
    sVar9 = 0;
    while (prVar5 = local_48, (char *)sVar9 != local_88) {
      uVar18 = (ulong)(local_48[sVar9].value & 0xff);
      pTVar16 = (*ppDVar13)->token_ + (local_48[sVar9].value >> 8);
      local_60 = sVar9;
      while (bVar19 = uVar18 != 0, uVar18 = uVar18 - 1, bVar19) {
        pmVar8 = Allocator<mecab_node_t,_mecab_path_t>::newNode(local_80);
        new_node = pmVar8;
        anon_unknown_23::read_node_info(*ppDVar13,pTVar16,&new_node);
        uVar6 = (unsigned_short)prVar5[sVar9].length;
        pmVar8->length = uVar6;
        pmVar8->rlength = uVar6 + (sVar3 - (short)begin);
        pmVar8->surface = key;
        pmVar8->stat = '\0';
        pmVar8->char_type = (uchar)((uint)cinfo >> 0x12);
        pmVar8->bnext = local_b0;
        pTVar16 = pTVar16 + 1;
        local_b0 = pmVar8;
      }
      sVar9 = local_60 + 1;
    }
  }
  if (local_b0 != (mecab_node_t *)0x0 && -1 < (int)cinfo) {
    return local_b0;
  }
  pcVar14 = key + mblen;
  if (local_70 < pcVar14) {
    ppVar1 = (this->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar18 = (ulong)((uint)cinfo >> 0xe & 0xff0);
    pTVar16 = *(Token **)((long)&ppVar1->first + uVar18);
    lVar15 = *(long *)((long)&ppVar1->second + uVar18);
    sVar2 = (short)local_78;
    while (bVar19 = lVar15 != 0, lVar15 = lVar15 + -1, bVar19) {
      pmVar8 = Allocator<mecab_node_t,_mecab_path_t>::newNode(local_80);
      new_node = pmVar8;
      anon_unknown_23::read_node_info(&this->unkdic_,pTVar16,&new_node);
      pmVar8->char_type = (uchar)((uint)cinfo >> 0x12);
      pmVar8->surface = key;
      pmVar8->length = (unsigned_short)sVar9;
      pmVar8->rlength = (short)pcVar14 - sVar2;
      pmVar8->stat = '\x01';
      pmVar8->bnext = local_b0;
      pcVar17 = (this->unk_feature_).super_scoped_array<char>.ptr_;
      if (pcVar17 != (char *)0x0) {
        pmVar8->feature = pcVar17;
      }
      pTVar16 = pTVar16 + 1;
      local_b0 = pmVar8;
    }
    if (local_b0 != (mecab_node_t *)0x0) {
      return local_b0;
    }
    local_b0 = (mecab_node_t *)0x0;
  }
  pcVar17 = local_70;
  if (((uint)cinfo >> 0x1e & 1) == 0) {
    pcVar10 = (char *)0x0;
  }
  else {
    fail = (CharInfo)0x0;
    local_88 = CharProperty::seekToOtherType(local_50,pcVar14,local_70,cinfo,&fail,&mblen,&clen);
    pcVar10 = local_88;
    if (clen <= this->max_grouping_size_) {
      ppVar1 = (this->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = (ulong)((uint)cinfo >> 0xe & 0xff0);
      pTVar16 = *(Token **)((long)&ppVar1->first + uVar18);
      lVar15 = *(long *)((long)&ppVar1->second + uVar18);
      sVar4 = (short)local_88;
      sVar2 = (short)local_78;
      while (bVar19 = lVar15 != 0, lVar15 = lVar15 + -1, pcVar10 = local_88, pcVar17 = local_70,
            bVar19) {
        pmVar8 = Allocator<mecab_node_t,_mecab_path_t>::newNode(local_80);
        new_node = pmVar8;
        anon_unknown_23::read_node_info(&this->unkdic_,pTVar16,&new_node);
        pmVar8->char_type = (uchar)((uint)cinfo >> 0x12);
        pmVar8->surface = key;
        pmVar8->length = sVar4 - sVar3;
        pmVar8->rlength = sVar4 - sVar2;
        pmVar8->stat = '\x01';
        pmVar8->bnext = local_b0;
        pcVar17 = (this->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar17 != (char *)0x0) {
          pmVar8->feature = pcVar17;
        }
        pTVar16 = pTVar16 + 1;
        local_b0 = pmVar8;
      }
    }
  }
  uVar18 = 1;
  CVar11 = cinfo;
  local_88 = pcVar10;
  do {
    sVar2 = (short)pcVar14;
    if ((((uint)CVar11 >> 0x1a & 0xf) < uVar18) || (pcVar17 < pcVar14)) goto LAB_00124083;
    if (pcVar14 != pcVar10) {
      ppVar1 = (this->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (ulong)((uint)CVar11 >> 0xe & 0xff0);
      pTVar16 = *(Token **)((long)&ppVar1->first + uVar12);
      lVar15 = *(long *)((long)&ppVar1->second + uVar12);
      sVar4 = (short)local_78;
      local_60 = uVar18;
      clen = uVar18;
      while (pcVar17 = local_70, bVar19 = lVar15 != 0, lVar15 = lVar15 + -1, bVar19) {
        pmVar8 = Allocator<mecab_node_t,_mecab_path_t>::newNode(local_80);
        new_node = pmVar8;
        anon_unknown_23::read_node_info(&this->unkdic_,pTVar16,&new_node);
        pmVar8->char_type = (uchar)((uint)cinfo >> 0x12);
        pmVar8->surface = key;
        pmVar8->length = sVar2 - sVar3;
        pmVar8->rlength = sVar2 - sVar4;
        pmVar8->stat = '\x01';
        pmVar8->bnext = local_b0;
        pcVar17 = (this->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar17 != (char *)0x0) {
          pmVar8->feature = pcVar17;
        }
        pTVar16 = pTVar16 + 1;
        local_b0 = pmVar8;
      }
      CVar7 = CharProperty::getCharInfo(local_50,pcVar14,local_70,&mblen);
      CVar11 = cinfo;
      if (((uint)CVar7 & (uint)cinfo & 0x3ffff) == 0) {
LAB_00124083:
        if (local_b0 == (mecab_node_t *)0x0) {
          ppVar1 = (this->unk_tokens_).
                   super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar18 = (ulong)((uint)CVar11 >> 0xe & 0xff0);
          pTVar16 = *(Token **)((long)&ppVar1->first + uVar18);
          lVar15 = *(long *)((long)&ppVar1->second + uVar18);
          sVar4 = (short)local_78;
          local_b0 = (mecab_node_t *)0x0;
          while (bVar19 = lVar15 != 0, lVar15 = lVar15 + -1, bVar19) {
            pmVar8 = Allocator<mecab_node_t,_mecab_path_t>::newNode(local_80);
            new_node = pmVar8;
            anon_unknown_23::read_node_info(&this->unkdic_,pTVar16,&new_node);
            pmVar8->char_type = (uchar)((uint)cinfo >> 0x12);
            pmVar8->surface = key;
            pmVar8->length = sVar2 - sVar3;
            pmVar8->rlength = sVar2 - sVar4;
            pmVar8->stat = '\x01';
            pmVar8->bnext = local_b0;
            pcVar14 = (this->unk_feature_).super_scoped_array<char>.ptr_;
            if (pcVar14 != (char *)0x0) {
              pmVar8->feature = pcVar14;
            }
            pTVar16 = pTVar16 + 1;
            local_b0 = pmVar8;
          }
        }
        return local_b0;
      }
      pcVar14 = pcVar14 + mblen;
      pcVar10 = local_88;
      uVar18 = local_60;
    }
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

N *Tokenizer<N, P>::lookup(const char *begin, const char *end,
                           Allocator<N, P> *allocator, Lattice *lattice) const {
  CharInfo cinfo;
  N *result_node = 0;
  size_t mblen = 0;
  size_t clen = 0;

  end = static_cast<size_t>(end - begin) >= 65535 ? begin + 65535 : end;

  if (isPartial) {
    const size_t begin_pos = begin - lattice->sentence();
    for (size_t n = begin_pos + 1; n < lattice->size(); ++n) {
      if (lattice->boundary_constraint(n) == MECAB_TOKEN_BOUNDARY) {
        end = lattice->sentence() + n;
        break;
      }
    }
  }

  const char *begin2 = property_.seekToOtherType(begin, end, space_,
                                                 &cinfo, &mblen, &clen);

  Dictionary::result_type *daresults = allocator->mutable_results();
  const size_t results_size = allocator->results_size();

  for (std::vector<Dictionary *>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    const size_t n = (*it)->commonPrefixSearch(
        begin2,
        static_cast<size_t>(end - begin2),
        daresults, results_size);

    for (size_t i = 0; i < n; ++i) {
      size_t size = (*it)->token_size(daresults[i]);
      const Token *token = (*it)->token(daresults[i]);
      for (size_t j = 0; j < size; ++j) {
        N *new_node = allocator->newNode();
        read_node_info(**it, *(token + j), &new_node);
        new_node->length = daresults[i].length;
        new_node->rlength = begin2 - begin + new_node->length;
        new_node->surface = begin2;
        new_node->stat = MECAB_NOR_NODE;
        new_node->char_type = cinfo.default_type;
        if (isPartial && !is_valid_node(lattice, new_node)) {
          continue;
        }
        new_node->bnext = result_node;
        result_node = new_node;
      }
    }
  }

  if (result_node && !cinfo.invoke) {
    return result_node;
  }

  const char *begin3 = begin2 + mblen;
  const char *group_begin3 = 0;

  if (begin3 > end) {
    ADDUNKNWON;
    if (result_node) {
    return result_node;
  }
  }

  if (cinfo.group) {
    const char *tmp = begin3;
    CharInfo fail;
    begin3 = property_.seekToOtherType(begin3, end, cinfo,
                                       &fail, &mblen, &clen);
    if (clen <= max_grouping_size_) {
      ADDUNKNWON;
    }
    group_begin3 = begin3;
    begin3 = tmp;
  }

  for (size_t i = 1; i <= cinfo.length; ++i) {
    if (begin3 > end) {
      break;
    }
    if (begin3 == group_begin3) {
      continue;
    }
    clen = i;
    ADDUNKNWON;
    if (!cinfo.isKindOf(property_.getCharInfo(begin3, end, &mblen))) {
      break;
    }
    begin3 += mblen;
  }

  if (!result_node) {
    ADDUNKNWON;
  }

  if (isPartial && !result_node) {
    begin3 = begin2;
    while (true) {
      cinfo = property_.getCharInfo(begin3, end, &mblen);
      begin3 += mblen;
      if (begin3 > end ||
          lattice->boundary_constraint(begin3 - lattice->sentence())
          != MECAB_INSIDE_TOKEN) {
        break;
      }
    }
    ADDUNKNWON;

    if (!result_node) {
      N *new_node = allocator->newNode();
      new_node->char_type = cinfo.default_type;
      new_node->surface = begin2;
      new_node->length = begin3 - begin2;
      new_node->rlength = begin3 - begin;
      new_node->stat = MECAB_UNK_NODE;
      new_node->bnext = result_node;
      new_node->feature =
          lattice->feature_constraint(begin - lattice->sentence());
      CHECK_DIE(new_node->feature);
      result_node = new_node;
    }
  }

  return result_node;
}